

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiefiltermodel.h
# Opt level: O2

void __thiscall rlottie::internal::model::FilterData::addValue(FilterData *this,LOTVariant *value)

{
  Property PVar1;
  bool bVar2;
  
  PVar1 = value->mPropery;
  bVar2 = std::bitset<32UL>::test(&this->mBitset,(ulong)PVar1);
  if (bVar2) {
    std::
    replace_if<__gnu_cxx::__normal_iterator<LOTVariant*,std::vector<LOTVariant,std::allocator<LOTVariant>>>,rlottie::internal::model::FilterData::addValue(LOTVariant&)::_lambda(LOTVariant_const&)_1_,LOTVariant>
              ((this->mFilters).super__Vector_base<LOTVariant,_std::allocator<LOTVariant>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->mFilters).super__Vector_base<LOTVariant,_std::allocator<LOTVariant>_>._M_impl.
               super__Vector_impl_data._M_finish,(anon_class_8_1_a8c68091)value,value);
    return;
  }
  std::bitset<32UL>::set(&this->mBitset,(ulong)PVar1,true);
  std::vector<LOTVariant,_std::allocator<LOTVariant>_>::push_back(&this->mFilters,value);
  return;
}

Assistant:

void addValue(LOTVariant& value)
    {
        uint32_t index = static_cast<uint32_t>(value.property());
        if (mBitset.test(index)) {
            std::replace_if(mFilters.begin(), mFilters.end(),
                            [&value](const LOTVariant& e) {
                                return e.property() == value.property();
                            },
                            value);
        } else {
            mBitset.set(index);
            mFilters.push_back(value);
        }
    }